

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_sse2.c
# Opt level: O0

void av1_dist_wtd_convolve_x_sse2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  undefined8 uVar18;
  longlong lVar19;
  longlong lVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  int in_ECX;
  undefined4 *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  __m128i *extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar23 [16];
  __m128i *extraout_XMM0_Qb_03;
  long in_stack_00000008;
  int *in_stack_00000018;
  __m128i res_8_1;
  __m128i round_result_1;
  __m128i comp_avg_res_1;
  __m128i data_ref_0_1;
  __m128i res_unsigned_1;
  __m128i res_16b_1;
  __m128i res_hi_shift;
  __m128i res_lo_shift_1;
  __m128i res_hi_round;
  __m128i res_lo_round_1;
  __m128i res_hi;
  __m128i res_lo_1;
  __m128i res_odd;
  __m128i res_even;
  __m128i s_1 [4];
  __m128i data_1;
  int j;
  int i;
  __m128i res_8;
  __m128i round_result;
  __m128i comp_avg_res;
  __m128i data_ref_0;
  __m128i res_unsigned;
  __m128i res_16b;
  __m128i res_lo_shift;
  __m128i res_lo_round;
  __m128i res_lo;
  __m128i s [4];
  __m128i data;
  __m128i coeffs [4];
  __m128i rounding_const;
  int rounding_shift;
  __m128i offset_const;
  int offset;
  int offset_0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m128i wt;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  __m128i round_shift;
  __m128i round_const;
  __m128i left_shift;
  int bits;
  uint8_t *src_ptr;
  int fo_horiz;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  int bd;
  __m128i *in_stack_fffffffffffff838;
  __m128i *wt_00;
  __m128i *in_stack_fffffffffffff840;
  __m128i *res_unsigned_00;
  undefined2 in_stack_fffffffffffff848;
  undefined2 uVar24;
  undefined2 uVar25;
  undefined1 in_stack_fffffffffffff84e;
  byte bVar26;
  undefined1 in_stack_fffffffffffff858;
  undefined1 in_stack_fffffffffffff859;
  undefined1 in_stack_fffffffffffff85a;
  undefined1 in_stack_fffffffffffff85b;
  undefined1 in_stack_fffffffffffff85c;
  undefined1 in_stack_fffffffffffff85d;
  undefined1 in_stack_fffffffffffff85e;
  undefined1 in_stack_fffffffffffff85f;
  __m128i *in_stack_fffffffffffff870;
  __m128i *in_stack_fffffffffffff878;
  undefined8 local_758;
  undefined8 uStack_750;
  __m128i local_6c8;
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  longlong local_688;
  longlong lStack_680;
  int local_670;
  int local_66c;
  char local_668;
  char cStack_667;
  char cStack_666;
  char cStack_665;
  char cStack_664;
  char cStack_663;
  char cStack_662;
  char cStack_661;
  char cStack_660;
  char cStack_65f;
  char cStack_65e;
  char cStack_65d;
  char cStack_65c;
  char cStack_65b;
  char cStack_65a;
  char cStack_659;
  longlong local_648 [2];
  undefined8 local_638;
  undefined8 uStack_630;
  short local_628;
  short sStack_626;
  short sStack_624;
  short sStack_622;
  short sStack_620;
  short sStack_61e;
  short sStack_61c;
  short sStack_61a;
  undefined1 local_618 [16];
  int local_608;
  int iStack_604;
  int iStack_600;
  int iStack_5fc;
  int local_5f8;
  int iStack_5f4;
  int iStack_5f0;
  int iStack_5ec;
  undefined1 local_5d8;
  undefined1 uStack_5d7;
  undefined1 uStack_5d6;
  undefined1 uStack_5d5;
  undefined1 uStack_5d4;
  undefined1 uStack_5d3;
  undefined1 uStack_5d2;
  undefined1 uStack_5d1;
  undefined1 uStack_5d0;
  undefined1 uStack_5cf;
  undefined1 uStack_5ce;
  undefined1 uStack_5cd;
  undefined1 uStack_5cc;
  undefined1 uStack_5cb;
  undefined1 uStack_5ca;
  undefined1 uStack_5c9;
  undefined1 local_5c8;
  undefined1 uStack_5c7;
  undefined1 uStack_5c6;
  undefined1 uStack_5c5;
  undefined1 uStack_5c4;
  undefined1 uStack_5c3;
  undefined1 uStack_5c2;
  undefined1 uStack_5c1;
  undefined1 uStack_5c0;
  undefined1 uStack_5bf;
  undefined1 uStack_5be;
  undefined1 uStack_5bd;
  undefined1 uStack_5bc;
  undefined1 uStack_5bb;
  undefined1 uStack_5ba;
  undefined1 uStack_5b9;
  undefined1 local_5b8;
  undefined1 uStack_5b7;
  undefined1 uStack_5b6;
  undefined1 uStack_5b5;
  undefined1 uStack_5b4;
  undefined1 uStack_5b3;
  undefined1 uStack_5b2;
  undefined1 uStack_5b1;
  undefined1 uStack_5b0;
  undefined1 uStack_5af;
  undefined1 uStack_5ae;
  undefined1 uStack_5ad;
  undefined1 uStack_5ac;
  undefined1 uStack_5ab;
  undefined1 uStack_5aa;
  undefined1 uStack_5a9;
  undefined1 local_5a8;
  undefined1 uStack_5a7;
  undefined1 uStack_5a6;
  undefined1 uStack_5a5;
  undefined1 uStack_5a4;
  undefined1 uStack_5a3;
  undefined1 uStack_5a2;
  undefined1 uStack_5a1;
  undefined1 uStack_5a0;
  undefined1 uStack_59f;
  undefined1 uStack_59e;
  undefined1 uStack_59d;
  undefined1 uStack_59c;
  undefined1 uStack_59b;
  undefined1 uStack_59a;
  undefined1 uStack_599;
  undefined8 local_598;
  undefined8 uStack_590;
  longlong local_588 [8];
  longlong local_548;
  longlong lStack_540;
  int local_52c;
  longlong local_528;
  longlong lStack_520;
  int local_518;
  int local_514;
  int local_510;
  int local_50c;
  undefined2 local_508;
  undefined2 uStack_506;
  undefined2 uStack_504;
  undefined2 uStack_502;
  undefined2 uStack_500;
  undefined2 uStack_4fe;
  undefined2 uStack_4fc;
  undefined2 uStack_4fa;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  int local_4d0;
  int local_4cc;
  ulong local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  ulong local_4a8;
  undefined8 uStack_4a0;
  uint local_48c;
  undefined1 (*local_488) [16];
  int local_480;
  int local_47c;
  undefined8 *local_478;
  undefined4 local_470;
  int local_46c;
  int local_468;
  int local_464;
  undefined4 *local_460;
  int local_454;
  undefined1 local_448 [16];
  uint local_42c;
  undefined1 local_428 [16];
  uint local_418;
  int local_414;
  undefined2 local_410;
  undefined2 local_40e;
  undefined2 local_40c;
  undefined2 local_40a;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  long local_3e8;
  __m128i *local_3e0;
  undefined8 *local_3d8;
  undefined1 (*local_3d0) [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  ulong local_348;
  undefined8 uStack_340;
  int local_338;
  int iStack_334;
  int iStack_330;
  int iStack_32c;
  ulong local_328;
  undefined8 uStack_320;
  int local_318;
  int iStack_314;
  int iStack_310;
  int iStack_30c;
  ulong local_308;
  undefined8 uStack_300;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  int local_298;
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  ulong local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 *local_110;
  int local_108;
  int iStack_104;
  int local_f8;
  int iStack_f4;
  int iStack_e0;
  int iStack_dc;
  int iStack_d0;
  int iStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  longlong local_48;
  longlong lStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  longlong local_28;
  longlong lStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_470 = 8;
  local_478 = *(undefined8 **)(in_stack_00000018 + 2);
  local_47c = in_stack_00000018[4];
  local_480 = (*(ushort *)(in_stack_00000008 + 8) >> 1) - 1;
  local_488 = (undefined1 (*) [16])(in_RDI - local_480);
  local_48c = 7 - in_stack_00000018[6];
  local_428._4_4_ = 0;
  local_428._0_4_ = local_48c;
  local_4a8 = local_428._0_8_;
  uStack_4a0 = 0;
  local_414 = (1 << (*(byte *)(in_stack_00000018 + 5) & 0x1f)) >> 1;
  local_4b8 = CONCAT44(local_414,local_414);
  uStack_4b0 = CONCAT44(local_414,local_414);
  local_42c = in_stack_00000018[5];
  local_448._4_4_ = 0;
  local_448._0_4_ = local_42c;
  local_4c8 = local_448._0_8_;
  uStack_4c0 = 0;
  local_4cc = in_stack_00000018[10];
  local_4d0 = in_stack_00000018[0xb];
  local_40a = (undefined2)local_4cc;
  local_6a = (undefined2)local_4cc;
  local_6c = (undefined2)local_4cc;
  local_6e = (undefined2)local_4cc;
  local_70 = (undefined2)local_4cc;
  local_72 = (undefined2)local_4cc;
  local_74 = (undefined2)local_4cc;
  local_76 = (undefined2)local_4cc;
  local_78 = (undefined2)local_4cc;
  local_4e8 = CONCAT26((undefined2)local_4cc,
                       CONCAT24((undefined2)local_4cc,
                                CONCAT22((undefined2)local_4cc,(undefined2)local_4cc)));
  uStack_4e0 = CONCAT26((undefined2)local_4cc,
                        CONCAT24((undefined2)local_4cc,
                                 CONCAT22((undefined2)local_4cc,(undefined2)local_4cc)));
  local_40c = (undefined2)local_4d0;
  local_4a = (undefined2)local_4d0;
  local_4c = (undefined2)local_4d0;
  local_4e = (undefined2)local_4d0;
  local_50 = (undefined2)local_4d0;
  local_52 = (undefined2)local_4d0;
  local_54 = (undefined2)local_4d0;
  local_56 = (undefined2)local_4d0;
  local_58 = (undefined2)local_4d0;
  local_4f8 = CONCAT26((undefined2)local_4d0,
                       CONCAT24((undefined2)local_4d0,
                                CONCAT22((undefined2)local_4d0,(undefined2)local_4d0)));
  uStack_4f0 = CONCAT26((undefined2)local_4d0,
                        CONCAT24((undefined2)local_4d0,
                                 CONCAT22((undefined2)local_4d0,(undefined2)local_4d0)));
  local_508 = (undefined2)local_4cc;
  uStack_506 = (undefined2)local_4d0;
  uStack_504 = (undefined2)local_4cc;
  uStack_502 = (undefined2)local_4d0;
  uStack_500 = (undefined2)local_4cc;
  uStack_4fe = (undefined2)local_4d0;
  uStack_4fc = (undefined2)local_4cc;
  uStack_4fa = (undefined2)local_4d0;
  local_50c = *in_stack_00000018;
  local_510 = in_stack_00000018[9];
  local_514 = 0x16 - (in_stack_00000018[5] + in_stack_00000018[6]);
  local_518 = (1 << ((byte)local_514 & 0x1f)) + (1 << ((byte)local_514 - 1 & 0x1f));
  local_40e = (undefined2)local_518;
  local_2a = (undefined2)local_518;
  local_2c = (undefined2)local_518;
  local_2e = (undefined2)local_518;
  local_30 = (undefined2)local_518;
  local_32 = (undefined2)local_518;
  local_34 = (undefined2)local_518;
  local_36 = (undefined2)local_518;
  local_38 = (undefined2)local_518;
  local_528 = CONCAT26((undefined2)local_518,
                       CONCAT24((undefined2)local_518,
                                CONCAT22((undefined2)local_518,(undefined2)local_518)));
  lStack_520 = CONCAT26((undefined2)local_518,
                        CONCAT24((undefined2)local_518,
                                 CONCAT22((undefined2)local_518,(undefined2)local_518)));
  local_52c = 0xe - (in_stack_00000018[5] + in_stack_00000018[6]);
  local_410 = (undefined2)((uint)(1 << ((byte)local_52c & 0x1f)) >> 1);
  local_548 = CONCAT26(local_410,CONCAT24(local_410,CONCAT22(local_410,local_410)));
  lStack_540 = CONCAT26(local_410,CONCAT24(local_410,CONCAT22(local_410,local_410)));
  uVar24 = (undefined2)local_4cc;
  uVar25 = (undefined2)local_4d0;
  bVar26 = (byte)local_514;
  local_46c = in_R9D;
  local_468 = in_R8D;
  local_464 = in_ECX;
  local_460 = in_RDX;
  local_454 = in_ESI;
  local_448 = ZEXT416(local_42c);
  local_428 = ZEXT416(local_48c);
  local_418 = local_48c;
  local_408 = local_4f8;
  uStack_400 = uStack_4f0;
  local_3f8 = local_4e8;
  uStack_3f0 = uStack_4e0;
  local_a8 = local_4b8;
  uStack_a0 = uStack_4b0;
  local_98 = local_414;
  local_94 = local_414;
  local_90 = local_414;
  local_8c = local_414;
  local_88 = local_4e8;
  uStack_80 = uStack_4e0;
  local_68 = local_4f8;
  uStack_60 = uStack_4f0;
  local_48 = local_528;
  lStack_40 = lStack_520;
  local_28 = local_548;
  lStack_20 = lStack_540;
  local_10 = local_410;
  local_e = local_410;
  local_c = local_410;
  local_a = local_410;
  local_8 = local_410;
  local_6 = local_410;
  local_4 = local_410;
  local_2 = local_410;
  prepare_coeffs((InterpFilterParams *)
                 CONCAT17(in_stack_fffffffffffff85f,
                          CONCAT16(in_stack_fffffffffffff85e,
                                   CONCAT15(in_stack_fffffffffffff85d,
                                            CONCAT14(in_stack_fffffffffffff85c,
                                                     CONCAT13(in_stack_fffffffffffff85b,
                                                              CONCAT12(in_stack_fffffffffffff85a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff859,
                                                  in_stack_fffffffffffff858))))))),
                 CONCAT22(local_410,(undefined2)local_518),
                 (__m128i *)
                 CONCAT17((byte)local_514,
                          CONCAT16(in_stack_fffffffffffff84e,
                                   CONCAT24((undefined2)local_4d0,
                                            CONCAT22((undefined2)local_4cc,in_stack_fffffffffffff848
                                                    )))));
  if (local_468 == 4) {
    do {
      local_3d0 = local_488;
      local_598 = *(undefined8 *)*local_488;
      uStack_590 = *(undefined8 *)(*local_488 + 8);
      auVar11 = *local_488;
      auVar9 = *local_488;
      auVar8 = *local_488;
      auVar23 = *local_488;
      local_358[0] = (undefined1)local_598;
      local_358[1] = (undefined1)((ulong)local_598 >> 8);
      local_358[2] = (undefined1)((ulong)local_598 >> 0x10);
      local_358[3] = (undefined1)((ulong)local_598 >> 0x18);
      local_358[4] = (undefined1)((ulong)local_598 >> 0x20);
      local_358[5] = (undefined1)((ulong)local_598 >> 0x28);
      local_358[6] = (undefined1)((ulong)local_598 >> 0x30);
      local_358[7] = (undefined1)((ulong)local_598 >> 0x38);
      local_368[0] = auVar23[1];
      local_368[1] = auVar23[2];
      local_368[2] = auVar23[3];
      local_368[3] = auVar23[4];
      local_368[4] = auVar23[5];
      local_368[5] = auVar23[6];
      local_368[6] = auVar23[7];
      local_368[7] = auVar23[8];
      local_5d8 = local_358[0];
      uStack_5d7 = local_368[0];
      uStack_5d6 = local_358[1];
      uStack_5d5 = local_368[1];
      uStack_5d4 = local_358[2];
      uStack_5d3 = local_368[2];
      uStack_5d2 = local_358[3];
      uStack_5d1 = local_368[3];
      uStack_5d0 = local_358[4];
      uStack_5cf = local_368[4];
      uStack_5ce = local_358[5];
      uStack_5cd = local_368[5];
      uStack_5cc = local_358[6];
      uStack_5cb = local_368[6];
      uStack_5ca = local_358[7];
      uStack_5c9 = local_368[7];
      local_378[0] = auVar8[2];
      local_378[1] = auVar8[3];
      local_378[2] = auVar8[4];
      local_378[3] = auVar8[5];
      local_378[4] = auVar8[6];
      local_378[5] = auVar8[7];
      local_378[6] = auVar8[8];
      local_378[7] = auVar8[9];
      local_388[7] = auVar8[10];
      local_5c8 = local_378[0];
      uStack_5c7 = local_378[1];
      uStack_5c6 = local_378[1];
      uStack_5c5 = local_378[2];
      uStack_5c4 = local_378[2];
      uStack_5c3 = local_378[3];
      uStack_5c2 = local_378[3];
      uStack_5c1 = local_378[4];
      uStack_5c0 = local_378[4];
      uStack_5bf = local_378[5];
      uStack_5be = local_378[5];
      uStack_5bd = local_378[6];
      uStack_5bc = local_378[6];
      uStack_5bb = local_378[7];
      uStack_5ba = local_378[7];
      uStack_5b9 = local_388[7];
      local_398[0] = auVar9[4];
      local_398[1] = auVar9[5];
      local_398[2] = auVar9[6];
      local_398[3] = auVar9[7];
      local_398[4] = auVar9[8];
      local_398[5] = auVar9[9];
      local_398[6] = auVar9[10];
      local_398[7] = auVar9[0xb];
      local_3a8[7] = auVar9[0xc];
      local_5b8 = local_398[0];
      uStack_5b7 = local_398[1];
      uStack_5b6 = local_398[1];
      uStack_5b5 = local_398[2];
      uStack_5b4 = local_398[2];
      uStack_5b3 = local_398[3];
      uStack_5b2 = local_398[3];
      uStack_5b1 = local_398[4];
      uStack_5b0 = local_398[4];
      uStack_5af = local_398[5];
      uStack_5ae = local_398[5];
      uStack_5ad = local_398[6];
      uStack_5ac = local_398[6];
      uStack_5ab = local_398[7];
      uStack_5aa = local_398[7];
      uStack_5a9 = local_3a8[7];
      local_3b8[0] = auVar11[6];
      local_3b8[1] = auVar11[7];
      local_3b8[2] = auVar11[8];
      local_3b8[3] = auVar11[9];
      local_3b8[4] = auVar11[10];
      local_3b8[5] = auVar11[0xb];
      local_3b8[6] = auVar11[0xc];
      local_3b8[7] = auVar11[0xd];
      local_3c8[7] = auVar11[0xe];
      local_5a8 = local_3b8[0];
      uStack_5a7 = local_3b8[1];
      uStack_5a6 = local_3b8[1];
      uStack_5a5 = local_3b8[2];
      uStack_5a4 = local_3b8[2];
      uStack_5a3 = local_3b8[3];
      uStack_5a2 = local_3b8[3];
      uStack_5a1 = local_3b8[4];
      uStack_5a0 = local_3b8[4];
      uStack_59f = local_3b8[5];
      uStack_59e = local_3b8[5];
      uStack_59d = local_3b8[6];
      uStack_59c = local_3b8[6];
      uStack_59b = local_3b8[7];
      uStack_59a = local_3b8[7];
      uStack_599 = local_3c8[7];
      local_3c8 = auVar11 >> 0x38;
      local_3b8 = auVar11 >> 0x30;
      local_3a8 = auVar9 >> 0x28;
      local_398 = auVar9 >> 0x20;
      local_388 = auVar8 >> 0x18;
      local_378 = auVar8 >> 0x10;
      local_368 = auVar23 >> 8;
      local_358 = auVar23;
      convolve_lo_x(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
      local_2a8 = local_4b8;
      uVar15 = local_2a8;
      uStack_2a0 = uStack_4b0;
      uVar16 = uStack_2a0;
      local_298 = (int)extraout_XMM0_Qa;
      iStack_294 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
      iStack_290 = (int)extraout_XMM0_Qb;
      iStack_28c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
      local_2a8._0_4_ = (int)local_4b8;
      local_2a8._4_4_ = (int)((ulong)local_4b8 >> 0x20);
      uStack_2a0._0_4_ = (int)uStack_4b0;
      uStack_2a0._4_4_ = (int)((ulong)uStack_4b0 >> 0x20);
      local_2f8 = local_298 + (int)local_2a8;
      iStack_2f4 = iStack_294 + local_2a8._4_4_;
      iStack_2f0 = iStack_290 + (int)uStack_2a0;
      iStack_2ec = iStack_28c + uStack_2a0._4_4_;
      local_308 = local_4c8;
      uStack_300 = uStack_4c0;
      auVar10._8_8_ = uStack_4c0;
      auVar10._0_8_ = local_4c8;
      local_5f8 = local_2f8 >> auVar10;
      iStack_5f4 = iStack_2f4 >> auVar10;
      iStack_5f0 = iStack_2f0 >> auVar10;
      iStack_5ec = iStack_2ec >> auVar10;
      local_238 = CONCAT44(iStack_5f4,local_5f8);
      uStack_230 = CONCAT44(iStack_5ec,iStack_5f0);
      local_248 = local_4a8;
      uVar17 = local_248;
      uStack_240 = uStack_4a0;
      uVar18 = uStack_240;
      local_248._0_4_ = (int)local_4a8;
      local_248._4_4_ = (int)(local_4a8 >> 0x20);
      uStack_240._0_4_ = (int)uStack_4a0;
      uStack_240._4_4_ = (int)((ulong)uStack_4a0 >> 0x20);
      local_608 = local_5f8 << (int)local_248;
      iStack_604 = iStack_5f4 << local_248._4_4_;
      iStack_600 = iStack_5f0 << (int)uStack_240;
      iStack_5fc = iStack_5ec << uStack_240._4_4_;
      local_1f8 = CONCAT44(iStack_604,local_608);
      uStack_1f0 = CONCAT44(iStack_5fc,iStack_600);
      local_208 = CONCAT44(iStack_604,local_608);
      uStack_200 = CONCAT44(iStack_5fc,iStack_600);
      auVar14._8_8_ = uStack_1f0;
      auVar14._0_8_ = local_1f8;
      auVar13._8_8_ = uStack_200;
      auVar13._0_8_ = local_208;
      local_618 = packssdw(auVar14,auVar13);
      local_1b8 = local_618._0_8_;
      uVar21 = local_1b8;
      uStack_1b0 = local_618._8_8_;
      uVar22 = uStack_1b0;
      local_1c8 = local_528;
      lVar19 = local_1c8;
      uStack_1c0 = lStack_520;
      lVar20 = uStack_1c0;
      local_1b8._0_2_ = local_618._0_2_;
      local_1b8._2_2_ = local_618._2_2_;
      local_1b8._4_2_ = local_618._4_2_;
      local_1b8._6_2_ = local_618._6_2_;
      uStack_1b0._0_2_ = local_618._8_2_;
      uStack_1b0._2_2_ = local_618._10_2_;
      uStack_1b0._4_2_ = local_618._12_2_;
      uStack_1b0._6_2_ = local_618._14_2_;
      local_1c8._0_2_ = (short)local_528;
      local_1c8._2_2_ = (short)((ulong)local_528 >> 0x10);
      local_1c8._4_2_ = (short)((ulong)local_528 >> 0x20);
      local_1c8._6_2_ = (short)((ulong)local_528 >> 0x30);
      uStack_1c0._0_2_ = (short)lStack_520;
      uStack_1c0._2_2_ = (short)((ulong)lStack_520 >> 0x10);
      uStack_1c0._4_2_ = (short)((ulong)lStack_520 >> 0x20);
      uStack_1c0._6_2_ = (short)((ulong)lStack_520 >> 0x30);
      local_628 = (short)local_1b8 + (short)local_1c8;
      sStack_626 = local_1b8._2_2_ + local_1c8._2_2_;
      sStack_624 = local_1b8._4_2_ + local_1c8._4_2_;
      sStack_622 = local_1b8._6_2_ + local_1c8._6_2_;
      sStack_620 = (short)uStack_1b0 + (short)uStack_1c0;
      sStack_61e = uStack_1b0._2_2_ + uStack_1c0._2_2_;
      sStack_61c = uStack_1b0._4_2_ + uStack_1c0._4_2_;
      sStack_61a = uStack_1b0._6_2_ + uStack_1c0._6_2_;
      local_2a8 = uVar15;
      uStack_2a0 = uVar16;
      local_248 = uVar17;
      uStack_240 = uVar18;
      local_1c8 = lVar19;
      uStack_1c0 = lVar20;
      local_1b8 = uVar21;
      uStack_1b0 = uVar22;
      if (local_50c == 0) {
        local_128 = CONCAT26(sStack_622,CONCAT24(sStack_624,CONCAT22(sStack_626,local_628)));
        uStack_120 = CONCAT26(sStack_61a,CONCAT24(sStack_61c,CONCAT22(sStack_61e,sStack_620)));
        local_110 = local_478;
        *local_478 = local_128;
        local_478[1] = uStack_120;
      }
      else {
        local_3d8 = local_478;
        local_638 = *local_478;
        uStack_630 = local_478[1];
        comp_avg((__m128i *)
                 CONCAT17(bVar26,CONCAT16(in_stack_fffffffffffff84e,
                                          CONCAT24(uVar25,CONCAT22(uVar24,in_stack_fffffffffffff848)
                                                  ))),in_stack_fffffffffffff840,
                 in_stack_fffffffffffff838,0);
        convolve_rounding(&local_648,(__m128i *)&local_528,(__m128i *)&local_548,local_52c);
        local_178 = (short)extraout_XMM0_Qa_00;
        sStack_176 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
        sStack_174 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        sStack_172 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
        sStack_170 = (short)extraout_XMM0_Qb_00;
        sStack_16e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
        sStack_16c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
        sStack_16a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
        local_668 = (0 < local_178) * (local_178 < 0x100) * (char)extraout_XMM0_Qa_00 -
                    (0xff < local_178);
        cVar1 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x10);
        cStack_667 = (0 < sStack_176) * (sStack_176 < 0x100) * cVar1 - (0xff < sStack_176);
        cVar2 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        cStack_666 = (0 < sStack_174) * (sStack_174 < 0x100) * cVar2 - (0xff < sStack_174);
        cVar3 = (char)((ulong)extraout_XMM0_Qa_00 >> 0x30);
        cStack_665 = (0 < sStack_172) * (sStack_172 < 0x100) * cVar3 - (0xff < sStack_172);
        cStack_664 = (0 < sStack_170) * (sStack_170 < 0x100) * (char)extraout_XMM0_Qb_00 -
                     (0xff < sStack_170);
        cVar4 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x10);
        cStack_663 = (0 < sStack_16e) * (sStack_16e < 0x100) * cVar4 - (0xff < sStack_16e);
        cVar5 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x20);
        cStack_662 = (0 < sStack_16c) * (sStack_16c < 0x100) * cVar5 - (0xff < sStack_16c);
        cVar6 = (char)((ulong)extraout_XMM0_Qb_00 >> 0x30);
        cStack_661 = (0 < sStack_16a) * (sStack_16a < 0x100) * cVar6 - (0xff < sStack_16a);
        cStack_660 = (0 < local_178) * (local_178 < 0x100) * (char)extraout_XMM0_Qa_00 -
                     (0xff < local_178);
        cStack_65f = (0 < sStack_176) * (sStack_176 < 0x100) * cVar1 - (0xff < sStack_176);
        cStack_65e = (0 < sStack_174) * (sStack_174 < 0x100) * cVar2 - (0xff < sStack_174);
        cStack_65d = (0 < sStack_172) * (sStack_172 < 0x100) * cVar3 - (0xff < sStack_172);
        cStack_65c = (0 < sStack_170) * (sStack_170 < 0x100) * (char)extraout_XMM0_Qb_00 -
                     (0xff < sStack_170);
        cStack_65b = (0 < sStack_16e) * (sStack_16e < 0x100) * cVar4 - (0xff < sStack_16e);
        cStack_65a = (0 < sStack_16c) * (sStack_16c < 0x100) * cVar5 - (0xff < sStack_16c);
        cStack_659 = (0 < sStack_16a) * (sStack_16a < 0x100) * cVar6 - (0xff < sStack_16a);
        uVar7 = CONCAT13(cStack_665,CONCAT12(cStack_666,CONCAT11(cStack_667,local_668)));
        local_168 = CONCAT17(cStack_661,
                             CONCAT16(cStack_662,CONCAT15(cStack_663,CONCAT14(cStack_664,uVar7))));
        uStack_160 = CONCAT17(cStack_659,
                              CONCAT16(cStack_65a,
                                       CONCAT15(cStack_65b,
                                                CONCAT14(cStack_65c,
                                                         CONCAT13(cStack_65d,
                                                                  CONCAT12(cStack_65e,
                                                                           CONCAT11(cStack_65f,
                                                                                    cStack_660))))))
                             );
        *local_460 = uVar7;
        local_158 = local_168;
        uStack_150 = uStack_160;
      }
      local_488 = (undefined1 (*) [16])(*local_488 + local_454);
      local_478 = (undefined8 *)((long)local_478 + (long)local_47c * 2);
      local_460 = (undefined4 *)((long)local_460 + (long)local_464);
      local_46c = local_46c + -1;
    } while (local_46c != 0);
  }
  else {
    local_66c = 0;
    do {
      local_670 = 0;
      do {
        local_3e0 = (__m128i *)(*local_488 + (local_66c * local_454 + local_670));
        local_688 = (*local_3e0)[0];
        lStack_680 = (*local_3e0)[1];
        local_6c8 = *local_3e0;
        local_6b8 = (undefined1  [16])*local_3e0 >> 0x10;
        local_6a8 = (undefined1  [16])*local_3e0 >> 0x20;
        local_698 = (undefined1  [16])*local_3e0 >> 0x30;
        wt_00 = &local_6c8;
        res_unsigned_00 = (__m128i *)local_588;
        convolve_lo_x(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        auVar23._8_8_ = lStack_680;
        auVar23._0_8_ = local_688;
        local_6c8 = (__m128i)(auVar23 >> 8);
        local_6b8._8_8_ = lStack_680;
        local_6b8._0_8_ = local_688;
        local_6b8 = local_6b8 >> 0x18;
        local_6a8._8_8_ = lStack_680;
        local_6a8._0_8_ = local_688;
        local_6a8 = local_6a8 >> 0x28;
        local_698._8_8_ = lStack_680;
        local_698._0_8_ = local_688;
        local_698 = local_698 >> 0x38;
        convolve_lo_x(in_stack_fffffffffffff878,in_stack_fffffffffffff870);
        local_f8 = (int)extraout_XMM0_Qa_01;
        iStack_f4 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
        local_108 = (int)extraout_XMM0_Qa_02;
        iStack_104 = (int)((ulong)extraout_XMM0_Qa_02 >> 0x20);
        iStack_d0 = (int)extraout_XMM0_Qb_01;
        iStack_cc = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
        iStack_e0 = (int)extraout_XMM0_Qb_02;
        iStack_dc = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
        local_2b8 = CONCAT44(local_108,local_f8);
        uStack_2b0 = CONCAT44(iStack_104,iStack_f4);
        local_2c8 = local_4b8;
        uVar15 = local_2c8;
        uStack_2c0 = uStack_4b0;
        uVar16 = uStack_2c0;
        local_2c8._0_4_ = (int)local_4b8;
        local_2c8._4_4_ = (int)((ulong)local_4b8 >> 0x20);
        uStack_2c0._0_4_ = (int)uStack_4b0;
        uStack_2c0._4_4_ = (int)((ulong)uStack_4b0 >> 0x20);
        local_318 = local_f8 + (int)local_2c8;
        iStack_314 = local_108 + local_2c8._4_4_;
        iStack_310 = iStack_f4 + (int)uStack_2c0;
        iStack_30c = iStack_104 + uStack_2c0._4_4_;
        local_328 = local_4c8;
        uStack_320 = uStack_4c0;
        auVar9._8_8_ = uStack_4c0;
        auVar9._0_8_ = local_4c8;
        local_2d8 = CONCAT44(iStack_e0,iStack_d0);
        uStack_2d0 = CONCAT44(iStack_dc,iStack_cc);
        local_2e8 = local_4b8;
        uStack_2e0 = uStack_4b0;
        local_338 = iStack_d0 + (int)local_2c8;
        iStack_334 = iStack_e0 + local_2c8._4_4_;
        iStack_330 = iStack_cc + (int)uStack_2c0;
        iStack_32c = iStack_dc + uStack_2c0._4_4_;
        local_348 = local_4c8;
        uStack_340 = uStack_4c0;
        auVar8._8_8_ = uStack_4c0;
        auVar8._0_8_ = local_4c8;
        local_258 = CONCAT44(iStack_314 >> auVar9,local_318 >> auVar9);
        uStack_250 = CONCAT44(iStack_30c >> auVar9,iStack_310 >> auVar9);
        local_268 = local_4a8;
        uVar17 = local_268;
        uStack_260 = uStack_4a0;
        uVar18 = uStack_260;
        local_268._0_4_ = (int)local_4a8;
        local_268._4_4_ = (int)(local_4a8 >> 0x20);
        uStack_260._0_4_ = (int)uStack_4a0;
        uStack_260._4_4_ = (int)((ulong)uStack_4a0 >> 0x20);
        local_278 = CONCAT44(iStack_334 >> auVar8,local_338 >> auVar8);
        uStack_270 = CONCAT44(iStack_32c >> auVar8,iStack_330 >> auVar8);
        local_288 = local_4a8;
        uStack_280 = uStack_4a0;
        local_218 = CONCAT44((iStack_314 >> auVar9) << local_268._4_4_,
                             (local_318 >> auVar9) << (int)local_268);
        uStack_210 = CONCAT44((iStack_30c >> auVar9) << uStack_260._4_4_,
                              (iStack_310 >> auVar9) << (int)uStack_260);
        local_228 = CONCAT44((iStack_334 >> auVar8) << local_268._4_4_,
                             (local_338 >> auVar8) << (int)local_268);
        uStack_220 = CONCAT44((iStack_32c >> auVar8) << uStack_260._4_4_,
                              (iStack_330 >> auVar8) << (int)uStack_260);
        auVar12._8_8_ = uStack_210;
        auVar12._0_8_ = local_218;
        auVar11._8_8_ = uStack_220;
        auVar11._0_8_ = local_228;
        auVar23 = packssdw(auVar12,auVar11);
        local_758 = auVar23._0_8_;
        uStack_750 = auVar23._8_8_;
        local_1d8 = local_758;
        uVar21 = local_1d8;
        uStack_1d0 = uStack_750;
        uVar22 = uStack_1d0;
        local_1e8 = local_528;
        lVar19 = local_1e8;
        uStack_1e0 = lStack_520;
        lVar20 = uStack_1e0;
        local_1d8._0_2_ = auVar23._0_2_;
        local_1d8._2_2_ = auVar23._2_2_;
        local_1d8._4_2_ = auVar23._4_2_;
        local_1d8._6_2_ = auVar23._6_2_;
        uStack_1d0._0_2_ = auVar23._8_2_;
        uStack_1d0._2_2_ = auVar23._10_2_;
        uStack_1d0._4_2_ = auVar23._12_2_;
        uStack_1d0._6_2_ = auVar23._14_2_;
        local_1e8._0_2_ = (short)local_528;
        local_1e8._2_2_ = (short)((ulong)local_528 >> 0x10);
        local_1e8._4_2_ = (short)((ulong)local_528 >> 0x20);
        local_1e8._6_2_ = (short)((ulong)local_528 >> 0x30);
        uStack_1e0._0_2_ = (short)lStack_520;
        uStack_1e0._2_2_ = (short)((ulong)lStack_520 >> 0x10);
        uStack_1e0._4_2_ = (short)((ulong)lStack_520 >> 0x20);
        uStack_1e0._6_2_ = (short)((ulong)lStack_520 >> 0x30);
        local_2c8 = uVar15;
        uStack_2c0 = uVar16;
        local_268 = uVar17;
        uStack_260 = uVar18;
        local_1e8 = lVar19;
        uStack_1e0 = lVar20;
        local_1d8 = uVar21;
        uStack_1d0 = uVar22;
        if (local_50c == 0) {
          local_130 = (undefined8 *)
                      ((long)local_478 + (long)(local_66c * local_47c + local_670) * 2);
          local_148 = CONCAT26(local_1d8._6_2_ + local_1e8._6_2_,
                               CONCAT24(local_1d8._4_2_ + local_1e8._4_2_,
                                        CONCAT22(local_1d8._2_2_ + local_1e8._2_2_,
                                                 (short)local_1d8 + (short)local_1e8)));
          uStack_140 = CONCAT26(uStack_1d0._6_2_ + uStack_1e0._6_2_,
                                CONCAT24(uStack_1d0._4_2_ + uStack_1e0._4_2_,
                                         CONCAT22(uStack_1d0._2_2_ + uStack_1e0._2_2_,
                                                  (short)uStack_1d0 + (short)uStack_1e0)));
          *local_130 = local_148;
          local_130[1] = uStack_140;
        }
        else {
          local_3e8 = (long)local_478 + (long)(local_66c * local_47c + local_670) * 2;
          comp_avg((__m128i *)
                   CONCAT17(bVar26,CONCAT16(in_stack_fffffffffffff84e,
                                            CONCAT24(uVar25,CONCAT22(uVar24,
                                                  in_stack_fffffffffffff848)))),res_unsigned_00,
                   wt_00,0);
          in_stack_fffffffffffff878 = extraout_XMM0_Qa_03;
          convolve_rounding((__m128i *)&stack0xfffffffffffff878,(__m128i *)&local_528,
                            (__m128i *)&local_548,local_52c);
          local_198 = (short)extraout_XMM0_Qa_04;
          sStack_196 = (short)((ulong)extraout_XMM0_Qa_04 >> 0x10);
          sStack_194 = (short)((ulong)extraout_XMM0_Qa_04 >> 0x20);
          sStack_192 = (short)((ulong)extraout_XMM0_Qa_04 >> 0x30);
          sStack_190 = (short)extraout_XMM0_Qb_03;
          sStack_18e = (short)((ulong)extraout_XMM0_Qb_03 >> 0x10);
          sStack_18c = (short)((ulong)extraout_XMM0_Qb_03 >> 0x20);
          sStack_18a = (short)((ulong)extraout_XMM0_Qb_03 >> 0x30);
          cVar1 = (char)((ulong)extraout_XMM0_Qa_04 >> 0x10);
          cVar2 = (char)((ulong)extraout_XMM0_Qa_04 >> 0x20);
          cVar3 = (char)((ulong)extraout_XMM0_Qa_04 >> 0x30);
          cVar4 = (char)((ulong)extraout_XMM0_Qb_03 >> 0x10);
          cVar5 = (char)((ulong)extraout_XMM0_Qb_03 >> 0x20);
          cVar6 = (char)((ulong)extraout_XMM0_Qb_03 >> 0x30);
          local_b0 = (undefined8 *)((long)local_460 + (long)(local_66c * local_464 + local_670));
          local_c8 = CONCAT17((0 < sStack_18a) * (sStack_18a < 0x100) * cVar6 - (0xff < sStack_18a),
                              CONCAT16((0 < sStack_18c) * (sStack_18c < 0x100) * cVar5 -
                                       (0xff < sStack_18c),
                                       CONCAT15((0 < sStack_18e) * (sStack_18e < 0x100) * cVar4 -
                                                (0xff < sStack_18e),
                                                CONCAT14((0 < sStack_190) * (sStack_190 < 0x100) *
                                                         (char)extraout_XMM0_Qb_03 -
                                                         (0xff < sStack_190),
                                                         CONCAT13((0 < sStack_192) *
                                                                  (sStack_192 < 0x100) * cVar3 -
                                                                  (0xff < sStack_192),
                                                                  CONCAT12((0 < sStack_194) *
                                                                           (sStack_194 < 0x100) *
                                                                           cVar2 - (0xff < 
                                                  sStack_194),
                                                  CONCAT11((0 < sStack_196) * (sStack_196 < 0x100) *
                                                           cVar1 - (0xff < sStack_196),
                                                           (0 < local_198) * (local_198 < 0x100) *
                                                           (char)extraout_XMM0_Qa_04 -
                                                           (0xff < local_198))))))));
          uStack_c0 = CONCAT17((0 < sStack_18a) * (sStack_18a < 0x100) * cVar6 - (0xff < sStack_18a)
                               ,CONCAT16((0 < sStack_18c) * (sStack_18c < 0x100) * cVar5 -
                                         (0xff < sStack_18c),
                                         CONCAT15((0 < sStack_18e) * (sStack_18e < 0x100) * cVar4 -
                                                  (0xff < sStack_18e),
                                                  CONCAT14((0 < sStack_190) * (sStack_190 < 0x100) *
                                                           (char)extraout_XMM0_Qb_03 -
                                                           (0xff < sStack_190),
                                                           CONCAT13((0 < sStack_192) *
                                                                    (sStack_192 < 0x100) * cVar3 -
                                                                    (0xff < sStack_192),
                                                                    CONCAT12((0 < sStack_194) *
                                                                             (sStack_194 < 0x100) *
                                                                             cVar2 - (0xff < 
                                                  sStack_194),
                                                  CONCAT11((0 < sStack_196) * (sStack_196 < 0x100) *
                                                           cVar1 - (0xff < sStack_196),
                                                           (0 < local_198) * (local_198 < 0x100) *
                                                           (char)extraout_XMM0_Qa_04 -
                                                           (0xff < local_198))))))));
          *local_b0 = local_c8;
          in_stack_fffffffffffff870 = extraout_XMM0_Qb_03;
        }
        local_670 = local_670 + 8;
      } while (local_670 < local_468);
      local_66c = local_66c + 1;
    } while (local_66c < local_46c);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_x_sse2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const int subpel_x_qn,
                                  ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  const int dst_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint8_t *src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_1;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const __m128i round_const = _mm_set1_epi32((1 << conv_params->round_0) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16(w0);
  const __m128i wt1 = _mm_set1_epi16(w1);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);
  __m128i coeffs[4];

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs);

  if (w == 4) {
    do {
      const __m128i data = _mm_loadu_si128((__m128i *)src_ptr);
      __m128i s[4];

      s[0] = _mm_unpacklo_epi8(data, _mm_srli_si128(data, 1));
      s[1] =
          _mm_unpacklo_epi8(_mm_srli_si128(data, 2), _mm_srli_si128(data, 3));
      s[2] =
          _mm_unpacklo_epi8(_mm_srli_si128(data, 4), _mm_srli_si128(data, 5));
      s[3] =
          _mm_unpacklo_epi8(_mm_srli_si128(data, 6), _mm_srli_si128(data, 7));
      const __m128i res_lo = convolve_lo_x(s, coeffs);
      const __m128i res_lo_round =
          _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
      const __m128i res_lo_shift = _mm_sll_epi32(res_lo_round, left_shift);

      const __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_lo_shift);
      const __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

      // Accumulate values into the destination buffer
      if (do_average) {
        const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)dst);

        const __m128i comp_avg_res =
            comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

        const __m128i round_result = convolve_rounding(
            &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

        const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
        *(int *)(&dst0[0]) = _mm_cvtsi128_si32(res_8);
      } else {
        _mm_store_si128((__m128i *)(&dst[0]), res_unsigned);
      }
      src_ptr += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;
    } while (--h);
  } else {
    assert(!(w % 8));
    int i = 0;
    do {
      int j = 0;
      do {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
        __m128i s[4];

        // Filter even-index pixels
        s[0] = data;
        s[1] = _mm_srli_si128(data, 2);
        s[2] = _mm_srli_si128(data, 4);
        s[3] = _mm_srli_si128(data, 6);
        const __m128i res_even = convolve_lo_x(s, coeffs);

        // Filter odd-index pixels
        s[0] = _mm_srli_si128(data, 1);
        s[1] = _mm_srli_si128(data, 3);
        s[2] = _mm_srli_si128(data, 5);
        s[3] = _mm_srli_si128(data, 7);
        const __m128i res_odd = convolve_lo_x(s, coeffs);

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);
        const __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
        const __m128i res_hi_round =
            _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);
        const __m128i res_lo_shift = _mm_sll_epi32(res_lo_round, left_shift);
        const __m128i res_hi_shift = _mm_sll_epi32(res_hi_round, left_shift);

        const __m128i res_16b = _mm_packs_epi32(res_lo_shift, res_hi_shift);
        const __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);
          _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
        j += 8;
      } while (j < w);
    } while (++i < h);
  }
}